

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall
QTableWidgetPrivate::emitCurrentItemChanged
          (QTableWidgetPrivate *this,QModelIndex *current,QModelIndex *previous)

{
  QTableWidget *this_00;
  QTableModel *pQVar1;
  QTableWidgetItem *_t1;
  QTableWidgetItem *_t2;
  
  this_00 = *(QTableWidget **)
             &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar1 = tableModel(this);
  _t1 = QTableModel::item(pQVar1,current);
  pQVar1 = tableModel(this);
  _t2 = QTableModel::item(pQVar1,previous);
  if (_t1 != (QTableWidgetItem *)0x0 || _t2 != (QTableWidgetItem *)0x0) {
    QTableWidget::currentItemChanged(this_00,_t1,_t2);
  }
  QTableWidget::currentCellChanged(this_00,current->r,current->c,previous->r,previous->c);
  return;
}

Assistant:

void QTableWidgetPrivate::emitCurrentItemChanged(const QModelIndex &current,
                                                 const QModelIndex &previous)
{
    Q_Q(QTableWidget);
    QTableWidgetItem *currentItem = tableModel()->item(current);
    QTableWidgetItem *previousItem = tableModel()->item(previous);
    if (currentItem || previousItem)
        emit q->currentItemChanged(currentItem, previousItem);
    emit q->currentCellChanged(current.row(), current.column(), previous.row(), previous.column());
}